

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionDefinitionRewriting.cpp
# Opt level: O3

Clause * performRewriting(Clause *rwClause,Literal *rwLit,TermList rwTerm,Clause *eqClause,
                         Literal *eqLit,TermList eqLHS,ResultSubstitutionSP *subst,
                         DemodulationHelper *helper,bool *isEqTautology,Inference *inf)

{
  Literal ***pppLVar1;
  Self SVar2;
  bool bVar3;
  int iVar4;
  TermList TVar5;
  undefined4 extraout_var;
  Literal *pLVar6;
  ulong uVar7;
  undefined4 extraout_var_00;
  Literal **ppLVar8;
  Clause *pCVar9;
  uint uVar10;
  long lVar11;
  Applicator appl;
  Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled> local_a8;
  Clause *local_98;
  TermList local_90;
  TermList local_88;
  Literal *local_80;
  SubstApplicator local_78;
  ResultSubstitution *local_70;
  Inference local_68;
  
  local_80 = eqLit;
  TVar5 = Kernel::EqHelper::getOtherEqualitySide(eqLit,eqLHS);
  TVar5._content._0_4_ = (*subst->_obj->_vptr_ResultSubstitution[0xf])(subst->_obj,TVar5._content);
  TVar5._content._4_4_ = extraout_var;
  local_70 = subst->_obj;
  local_78._vptr_SubstApplicator = (_func_int **)&PTR__SubstApplicator_00b38c18;
  if ((helper == (DemodulationHelper *)0x0) ||
     (bVar3 = Inferences::DemodulationHelper::isPremiseRedundant
                        (helper,rwClause,rwLit,rwTerm,TVar5,eqLHS,&local_78), bVar3)) {
    pLVar6 = Kernel::EqHelper::replace(rwLit,rwTerm,TVar5);
    if (((pLVar6->super_Term)._functor != 0) ||
       ((((pLVar6->super_Term)._args[0]._content & 4) == 0 ||
        (uVar7 = (ulong)(*(uint *)&(pLVar6->super_Term).field_0xc & 0xfffffff),
        (pLVar6->super_Term)._args[uVar7]._content != (pLVar6->super_Term)._args[uVar7 - 1]._content
        )))) {
      local_98 = rwClause;
      Lib::Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::
      Recycled(&local_a8);
      SVar2._M_t.
      super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
      .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>._M_head_impl =
           (__uniq_ptr_data<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>,_true,_true>
            )(__uniq_ptr_data<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>,_true,_true>
              )local_a8._self;
      ppLVar8 = *(Literal ***)
                 ((long)local_a8._self._M_t.
                        super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                        .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>._M_head_impl
                 + 0x10);
      if (ppLVar8 ==
          *(Literal ***)
           ((long)local_a8._self._M_t.
                  super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                  .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>._M_head_impl + 0x18
           )) {
        Lib::Stack<Kernel::Literal_*>::expand
                  ((Stack<Kernel::Literal_*> *)
                   local_a8._self._M_t.
                   super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                   .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>._M_head_impl);
        ppLVar8 = *(Literal ***)
                   ((long)SVar2._M_t.
                          super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                          .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>.
                          _M_head_impl + 0x10);
      }
      pCVar9 = local_98;
      *ppLVar8 = pLVar6;
      pppLVar1 = (Literal ***)
                 ((long)SVar2._M_t.
                        super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                        .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>._M_head_impl
                 + 0x10);
      *pppLVar1 = *pppLVar1 + 1;
      uVar10 = *(uint *)&local_98->field_0x38 & 0xfffff;
      local_90._content = TVar5._content;
      local_88._content = rwTerm._content;
      if (uVar10 != 0) {
        lVar11 = 0;
        do {
          if (pCVar9->_literals[lVar11] != rwLit) {
            pLVar6 = Kernel::EqHelper::replace(pCVar9->_literals[lVar11],local_88,local_90);
            SVar2._M_t.
            super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
            .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>._M_head_impl =
                 (__uniq_ptr_data<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>,_true,_true>
                  )(__uniq_ptr_data<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>,_true,_true>
                    )local_a8._self;
            if ((((pLVar6->super_Term)._functor == 0) &&
                (((pLVar6->super_Term)._args[0]._content & 4) != 0)) &&
               (uVar7 = (ulong)(*(uint *)&(pLVar6->super_Term).field_0xc & 0xfffffff),
               (pLVar6->super_Term)._args[uVar7]._content ==
               (pLVar6->super_Term)._args[uVar7 - 1]._content)) goto LAB_004cca30;
            ppLVar8 = *(Literal ***)
                       ((long)local_a8._self._M_t.
                              super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                              .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>.
                              _M_head_impl + 0x10);
            if (ppLVar8 ==
                *(Literal ***)
                 ((long)local_a8._self._M_t.
                        super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                        .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>._M_head_impl
                 + 0x18)) {
              Lib::Stack<Kernel::Literal_*>::expand
                        ((Stack<Kernel::Literal_*> *)
                         local_a8._self._M_t.
                         super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                         .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>._M_head_impl
                        );
              ppLVar8 = *(Literal ***)
                         ((long)SVar2._M_t.
                                super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                                .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>.
                                _M_head_impl + 0x10);
            }
            *ppLVar8 = pLVar6;
            pppLVar1 = (Literal ***)
                       ((long)SVar2._M_t.
                              super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                              .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>.
                              _M_head_impl + 0x10);
            *pppLVar1 = *pppLVar1 + 1;
          }
          lVar11 = lVar11 + 1;
        } while ((uint)lVar11 < uVar10);
      }
      uVar10 = *(uint *)&eqClause->field_0x38 & 0xfffff;
      if (uVar10 != 0) {
        lVar11 = 0;
        do {
          if (eqClause->_literals[lVar11] != local_80) {
            iVar4 = (*subst->_obj->_vptr_ResultSubstitution[0x10])();
            SVar2._M_t.
            super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
            .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>._M_head_impl =
                 (__uniq_ptr_data<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>,_true,_true>
                  )(__uniq_ptr_data<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>,_true,_true>
                    )local_a8._self;
            pLVar6 = (Literal *)CONCAT44(extraout_var_00,iVar4);
            if ((((pLVar6->super_Term)._functor == 0) &&
                (((pLVar6->super_Term)._args[0]._content & 4) != 0)) &&
               (uVar7 = (ulong)(*(uint *)&(pLVar6->super_Term).field_0xc & 0xfffffff),
               (pLVar6->super_Term)._args[uVar7]._content ==
               (pLVar6->super_Term)._args[uVar7 - 1]._content)) goto LAB_004cca30;
            ppLVar8 = *(Literal ***)
                       ((long)local_a8._self._M_t.
                              super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                              .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>.
                              _M_head_impl + 0x10);
            if (ppLVar8 ==
                *(Literal ***)
                 ((long)local_a8._self._M_t.
                        super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                        .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>._M_head_impl
                 + 0x18)) {
              Lib::Stack<Kernel::Literal_*>::expand
                        ((Stack<Kernel::Literal_*> *)
                         local_a8._self._M_t.
                         super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                         .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>._M_head_impl
                        );
              ppLVar8 = *(Literal ***)
                         ((long)SVar2._M_t.
                                super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                                .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>.
                                _M_head_impl + 0x10);
            }
            *ppLVar8 = pLVar6;
            pppLVar1 = (Literal ***)
                       ((long)SVar2._M_t.
                              super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                              .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>.
                              _M_head_impl + 0x10);
            *pppLVar1 = *pppLVar1 + 1;
          }
          lVar11 = lVar11 + 1;
        } while ((uint)lVar11 < uVar10);
      }
      local_68._0_8_ = *(undefined8 *)inf;
      local_68._8_4_ = *(undefined4 *)&inf->field_0x8;
      local_68._age = inf->_age;
      local_68._splits = inf->_splits;
      local_68._ptr1 = inf->_ptr1;
      local_68._ptr2 = inf->_ptr2;
      local_68.th_ancestors = inf->th_ancestors;
      local_68.all_ancestors = inf->all_ancestors;
      pCVar9 = Kernel::Clause::fromStack
                         ((Stack<Kernel::Literal_*> *)
                          local_a8._self._M_t.
                          super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                          .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>.
                          _M_head_impl,&local_68);
      goto LAB_004cca11;
    }
    *isEqTautology = true;
  }
  return (Clause *)0x0;
LAB_004cca30:
  *isEqTautology = true;
  pCVar9 = (Clause *)0x0;
LAB_004cca11:
  Lib::Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::
  ~Recycled(&local_a8);
  return pCVar9;
}

Assistant:

Clause* performRewriting(
    Clause *rwClause, Literal *rwLit, TermList rwTerm, Clause *eqClause,
    Literal *eqLit, TermList eqLHS, ResultSubstitutionSP subst,
    DemodulationHelper* helper, bool& isEqTautology, Inference&& inf)
{
  ASS(!eqLHS.isVar());

  TermList tgtTerm = EqHelper::getOtherEqualitySide(eqLit, eqLHS);

  // This should be the case for code trees
  ASS(subst->isIdentityOnQueryWhenResultBound());
  TermList tgtTermS = subst->applyToBoundResult(tgtTerm);

  Applicator appl(subst.ptr());

  if (helper && !helper->isPremiseRedundant(rwClause,rwLit,rwTerm,tgtTermS,eqLHS,&appl)) {
    return 0;
  }

  Literal *tgtLitS = EqHelper::replace(rwLit, rwTerm, tgtTermS);
  if (EqHelper::isEqTautology(tgtLitS)) {
    isEqTautology = true;
    return 0;
  }

  RStack<Literal*> resLits;

  resLits->push(tgtLitS);

  for (Literal *curr : rwClause->iterLits()) {
    if (curr == rwLit) {
      continue;
    }
    curr = EqHelper::replace(curr, rwTerm, tgtTermS);

    if (EqHelper::isEqTautology(curr)) {
      isEqTautology = true;
      return nullptr;
    }

    resLits->push(curr);
  }

  for (Literal* curr : eqClause->iterLits()) {
    if (curr == eqLit) {
      continue;
    }
    Literal* currAfter = subst->applyToBoundResult(curr);

    if (EqHelper::isEqTautology(currAfter)) {
      isEqTautology = true;
      return nullptr;
    }

    resLits->push(currAfter);
  }

  return Clause::fromStack(*resLits, inf);
}